

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blitter_terminal.cpp
# Opt level: O1

char * __thiscall E64::blitter_ic::terminal_enter_command(blitter_ic *this,uint8_t no)

{
  bool *pbVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  bool *pbVar5;
  undefined7 in_register_00000031;
  blit_t *pbVar6;
  ulong uVar7;
  ulong uVar8;
  
  pbVar6 = this->blit;
  iVar4 = (int)CONCAT71(in_register_00000031,no);
  uVar3 = *(uint *)(pbVar6->command_buffer + ((ulong)(uint)(iVar4 * 0x140) - 0xd));
  bVar2 = pbVar6->command_buffer[(ulong)(uint)(iVar4 * 0x140) - 0x41];
  uVar8 = (ulong)bVar2;
  if (uVar8 != 0) {
    uVar7 = 0;
    do {
      pbVar6->command_buffer[uVar7 + (uint)(iVar4 * 0x140)] =
           this->tile_ram
           [((uVar3 - (uVar3 & 0xffff) % (uint)bVar2) + (int)uVar7 & 0xffff) + iVar4 * 0x2000 &
            0x1fffff];
      uVar7 = uVar7 + 1;
      pbVar6 = this->blit;
      uVar8 = (ulong)(byte)pbVar6->command_buffer[(ulong)(uint)(iVar4 * 0x140) - 0x41];
    } while (uVar7 < uVar8);
  }
  pbVar5 = (bool *)(pbVar6->command_buffer + (uint)(iVar4 * 0x140) + uVar8 + 1);
  do {
    pbVar1 = pbVar5 + -2;
    pbVar5 = pbVar5 + -1;
  } while (*pbVar1 == true);
  *pbVar5 = false;
  return this->blit->command_buffer + (uint)(iVar4 * 0x140);
}

Assistant:

char *E64::blitter_ic::terminal_enter_command(uint8_t no)
{
	uint16_t start_of_line = blit[no].cursor_position - (blit[no].cursor_position % blit[no].get_columns());
	for (size_t i = 0; i < blit[no].get_columns(); i++) {
		blit[no].command_buffer[i] = terminal_get_tile(no, start_of_line + i);
	}
	size_t i = blit[no].get_columns() - 1;
	while (blit[no].command_buffer[i] == ' ') i--;
	blit[no].command_buffer[i + 1] = 0;

	return blit[no].command_buffer;
}